

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O0

void EDColor::InitColorEDLib(void)

{
  double dVar1;
  double d_1;
  int i_1;
  double d;
  int i;
  double inc;
  
  if (!LUT_Initialized) {
    for (d._4_4_ = 0; d._4_4_ < 0x400001; d._4_4_ = d._4_4_ + 1) {
      dVar1 = (double)d._4_4_ * 2.384185791015625e-07;
      if (dVar1 < 0.04045) {
        LUT1[d._4_4_] = dVar1 / 12.92;
      }
      else {
        dVar1 = pow((dVar1 + 0.055) / 1.055,2.4);
        LUT1[d._4_4_] = dVar1;
      }
    }
    for (d_1._4_4_ = 0; d_1._4_4_ < 0x400001; d_1._4_4_ = d_1._4_4_ + 1) {
      dVar1 = (double)d_1._4_4_ * 2.384185791015625e-07;
      if (dVar1 <= 0.008856) {
        LUT2[d_1._4_4_] = dVar1 * 7.787 + 0.13793103448275862;
      }
      else {
        dVar1 = pow(dVar1,0.3333333333333333);
        LUT2[d_1._4_4_] = dVar1;
      }
    }
    LUT_Initialized = true;
  }
  return;
}

Assistant:

void EDColor::InitColorEDLib()
{
	if (LUT_Initialized) 
		return;

	double inc = 1.0 / LUT_SIZE;
	for (int i = 0; i <= LUT_SIZE; i++) {
		double d = i * inc;

		if (d >= 0.04045) LUT1[i] = pow(((d + 0.055) / 1.055), 2.4);
		else              LUT1[i] = d / 12.92;
	} //end-for

	inc = 1.0 / LUT_SIZE;
	for (int i = 0; i <= LUT_SIZE; i++) {
		double d = i * inc;

		if (d > 0.008856) LUT2[i] = pow(d, 1.0 / 3.0);
		else              LUT2[i] = (7.787*d) + (16.0 / 116.0);
	} //end-for

	LUT_Initialized = true;
}